

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O2

mat33 * nifti_mat33_polar(mat33 A)

{
  mat33 R;
  mat33 A_00;
  mat33 R_00;
  mat33 R_01;
  mat33 A_01;
  mat33 A_02;
  mat33 A_03;
  mat33 A_04;
  undefined8 uVar1;
  undefined8 uVar2;
  uint uVar3;
  mat33 *in_RDI;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined8 in_stack_00000008;
  undefined8 in_stack_00000010;
  undefined8 in_stack_00000018;
  undefined8 in_stack_00000020;
  float in_stack_00000028;
  mat33 X;
  float local_80;
  float local_7c;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  float local_58;
  float local_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  float local_28;
  
  local_78 = in_stack_00000008;
  uVar1 = local_78;
  uStack_70 = in_stack_00000010;
  local_68 = in_stack_00000018;
  uVar2 = local_68;
  uStack_60 = in_stack_00000020;
  R.m._8_8_ = in_stack_00000010;
  R.m[0]._0_8_ = in_stack_00000008;
  R.m[1]._4_8_ = in_stack_00000018;
  R.m[2]._0_8_ = in_stack_00000020;
  R.m[2][2] = in_stack_00000028;
  fVar4 = nifti_mat33_determ(R);
  local_78._0_4_ = (float)in_stack_00000008;
  local_80 = (float)local_78;
  local_68._0_4_ = (float)in_stack_00000018;
  local_7c = (float)local_68;
  local_4c = in_stack_00000028;
  local_78 = uVar1;
  local_68 = uVar2;
  while ((fVar4 == 0.0 && (!NAN(fVar4)))) {
    A_00.m._8_8_ = in_stack_00000010;
    A_00.m[0][0] = (float)local_78;
    A_00.m[0][1] = local_78._4_4_;
    A_00.m[1][1] = (float)local_68;
    A_00.m[1][2] = local_68._4_4_;
    A_00.m[2]._0_8_ = in_stack_00000020;
    A_00.m[2][2] = local_4c;
    fVar4 = nifti_mat33_rownorm(A_00);
    fVar4 = (fVar4 + 0.001) * 1e-05;
    local_80 = local_80 + fVar4;
    local_78 = CONCAT44(local_78._4_4_,local_80);
    local_7c = local_7c + fVar4;
    local_68 = CONCAT44(local_68._4_4_,local_7c);
    local_4c = local_4c + fVar4;
    R_00.m._8_8_ = in_stack_00000010;
    R_00.m[0][0] = local_80;
    R_00.m[0][1] = local_78._4_4_;
    R_00.m[1][1] = local_7c;
    R_00.m[1][2] = local_68._4_4_;
    R_00.m[2]._0_8_ = in_stack_00000020;
    R_00.m[2][2] = local_4c;
    fVar4 = nifti_mat33_determ(R_00);
  }
  uVar3 = 0;
  local_80 = 1.0;
  local_58 = local_4c;
  while( true ) {
    R_01.m[0][2] = (float)uStack_70;
    R_01.m[1][0] = uStack_70._4_4_;
    R_01.m[0][0] = (float)local_78;
    R_01.m[0][1] = local_78._4_4_;
    R_01.m[1][1] = (float)local_68;
    R_01.m[1][2] = local_68._4_4_;
    R_01.m[2][0] = (float)uStack_60;
    R_01.m[2][1] = uStack_60._4_4_;
    R_01.m[2][2] = local_58;
    nifti_mat33_inverse(R_01);
    fVar5 = 1.0;
    fVar4 = 1.0;
    if (0.3 < local_80) {
      A_01.m[0][2] = (float)uStack_70;
      A_01.m[1][0] = uStack_70._4_4_;
      A_01.m[0][0] = (float)local_78;
      A_01.m[0][1] = local_78._4_4_;
      A_01.m[1][1] = (float)local_68;
      A_01.m[1][2] = local_68._4_4_;
      A_01.m[2][0] = (float)uStack_60;
      A_01.m[2][1] = uStack_60._4_4_;
      A_01.m[2][2] = local_58;
      fVar4 = nifti_mat33_rownorm(A_01);
      A_02.m[0][2] = (float)uStack_70;
      A_02.m[1][0] = uStack_70._4_4_;
      A_02.m[0][0] = (float)local_78;
      A_02.m[0][1] = local_78._4_4_;
      A_02.m[1][1] = (float)local_68;
      A_02.m[1][2] = local_68._4_4_;
      A_02.m[2][0] = (float)uStack_60;
      A_02.m[2][1] = uStack_60._4_4_;
      A_02.m[2][2] = local_58;
      fVar5 = nifti_mat33_colnorm(A_02);
      fVar5 = fVar5 * fVar4;
      if (fVar5 < 0.0) {
        fVar5 = sqrtf(fVar5);
      }
      else {
        fVar5 = SQRT(fVar5);
      }
      A_03.m[0][1] = fStack_44;
      A_03.m[0][0] = local_48;
      A_03.m[1][0] = fStack_3c;
      A_03.m[0][2] = fStack_40;
      A_03.m[1][2] = fStack_34;
      A_03.m[1][1] = local_38;
      A_03.m[2][1] = fStack_2c;
      A_03.m[2][0] = fStack_30;
      A_03.m[2][2] = local_28;
      fVar6 = nifti_mat33_rownorm(A_03);
      A_04.m[0][1] = fStack_44;
      A_04.m[0][0] = local_48;
      A_04.m[1][0] = fStack_3c;
      A_04.m[0][2] = fStack_40;
      A_04.m[1][2] = fStack_34;
      A_04.m[1][1] = local_38;
      A_04.m[2][1] = fStack_2c;
      A_04.m[2][0] = fStack_30;
      A_04.m[2][2] = local_28;
      fVar4 = nifti_mat33_colnorm(A_04);
      fVar4 = fVar4 * fVar6;
      if (fVar4 < 0.0) {
        fVar4 = sqrtf(fVar4);
      }
      else {
        fVar4 = SQRT(fVar4);
      }
      fVar4 = fVar4 / fVar5;
      if (fVar4 < 0.0) {
        fVar4 = sqrtf(fVar4);
      }
      else {
        fVar4 = SQRT(fVar4);
      }
      fVar5 = 1.0 / fVar4;
    }
    fVar10 = (fVar4 * (float)local_78 + local_48 * fVar5) * 0.5;
    fVar11 = (fVar4 * local_78._4_4_ + fStack_3c * fVar5) * 0.5;
    fVar12 = (fVar4 * (float)uStack_70 + fStack_30 * fVar5) * 0.5;
    fVar13 = (fVar4 * uStack_70._4_4_ + fStack_44 * fVar5) * 0.5;
    in_RDI->m[0][0] = fVar10;
    in_RDI->m[0][1] = fVar11;
    in_RDI->m[0][2] = fVar12;
    in_RDI->m[1][0] = fVar13;
    fVar6 = (fVar4 * (float)local_68 + local_38 * fVar5) * 0.5;
    fVar7 = (fVar4 * local_68._4_4_ + fStack_2c * fVar5) * 0.5;
    fVar8 = (fVar4 * (float)uStack_60 + fStack_40 * fVar5) * 0.5;
    fVar9 = (fVar4 * uStack_60._4_4_ + fStack_34 * fVar5) * 0.5;
    in_RDI->m[1][1] = fVar6;
    in_RDI->m[1][2] = fVar7;
    in_RDI->m[2][0] = fVar8;
    in_RDI->m[2][1] = fVar9;
    fVar4 = (fVar4 * local_58 + fVar5 * local_28) * 0.5;
    in_RDI->m[2][2] = fVar4;
    if (99 < uVar3) break;
    local_80 = ABS(fVar4 - local_58) +
               ABS(fVar9 - uStack_60._4_4_) +
               ABS(fVar8 - (float)uStack_60) +
               ABS(fVar7 - local_68._4_4_) +
               ABS(fVar6 - (float)local_68) +
               ABS(fVar13 - uStack_70._4_4_) +
               ABS(fVar12 - (float)uStack_70) +
               ABS(fVar11 - local_78._4_4_) + ABS(fVar10 - (float)local_78);
    if (local_80 < 3e-06) {
      return in_RDI;
    }
    uVar3 = uVar3 + 1;
    local_58 = in_RDI->m[2][2];
    local_78 = *(undefined8 *)in_RDI->m[0];
    uStack_70 = *(undefined8 *)(in_RDI->m[0] + 2);
    local_68 = *(undefined8 *)(in_RDI->m[1] + 1);
    uStack_60 = *(undefined8 *)in_RDI->m[2];
  }
  return in_RDI;
}

Assistant:

mat33 nifti_mat33_polar( mat33 A )
{
   mat33 X , Y , Z ;
   float alp,bet,gam,gmi , dif=1.0f ;
   int k=0 ;

   X = A ;

   /* force matrix to be nonsingular */

   gam = nifti_mat33_determ(X) ;
   while( gam == 0.0 ){        /* perturb matrix */
     gam = (float)( 0.00001 * ( 0.001 + nifti_mat33_rownorm(X) ) ) ;
     X.m[0][0] += gam ; X.m[1][1] += gam ; X.m[2][2] += gam ;
     gam = nifti_mat33_determ(X) ;
   }

   while(1){
     Y = nifti_mat33_inverse(X) ;
     if( dif > 0.3 ){     /* far from convergence */
       alp = (float)( sqrt( nifti_mat33_rownorm(X) * nifti_mat33_colnorm(X) ) ) ;
       bet = (float)( sqrt( nifti_mat33_rownorm(Y) * nifti_mat33_colnorm(Y) ) ) ;
       gam = (float)( sqrt( bet / alp ) ) ;
       gmi = (float)( 1.0 / gam ) ;
     } else {
       gam = gmi = 1.0f ;  /* close to convergence */
     }
     Z.m[0][0] = (float)( 0.5 * ( gam*X.m[0][0] + gmi*Y.m[0][0] ) ) ;
     Z.m[0][1] = (float)( 0.5 * ( gam*X.m[0][1] + gmi*Y.m[1][0] ) ) ;
     Z.m[0][2] = (float)( 0.5 * ( gam*X.m[0][2] + gmi*Y.m[2][0] ) ) ;
     Z.m[1][0] = (float)( 0.5 * ( gam*X.m[1][0] + gmi*Y.m[0][1] ) ) ;
     Z.m[1][1] = (float)( 0.5 * ( gam*X.m[1][1] + gmi*Y.m[1][1] ) ) ;
     Z.m[1][2] = (float)( 0.5 * ( gam*X.m[1][2] + gmi*Y.m[2][1] ) ) ;
     Z.m[2][0] = (float)( 0.5 * ( gam*X.m[2][0] + gmi*Y.m[0][2] ) ) ;
     Z.m[2][1] = (float)( 0.5 * ( gam*X.m[2][1] + gmi*Y.m[1][2] ) ) ;
     Z.m[2][2] = (float)( 0.5 * ( gam*X.m[2][2] + gmi*Y.m[2][2] ) ) ;

     dif = (float)( fabs(Z.m[0][0]-X.m[0][0])+fabs(Z.m[0][1]-X.m[0][1])
          +fabs(Z.m[0][2]-X.m[0][2])+fabs(Z.m[1][0]-X.m[1][0])
          +fabs(Z.m[1][1]-X.m[1][1])+fabs(Z.m[1][2]-X.m[1][2])
          +fabs(Z.m[2][0]-X.m[2][0])+fabs(Z.m[2][1]-X.m[2][1])
          +fabs(Z.m[2][2]-X.m[2][2])                          );

     k = k+1 ;
     if( k > 100 || dif < 3.e-6 ) break ;  /* convergence or exhaustion */
     X = Z ;
   }

   return Z ;
}